

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O3

FormatDescriptor *
ktx::createFormatDescriptor
          (FormatDescriptor *__return_storage_ptr__,VkFormat vkFormat,Reporter *report)

{
  int iVar1;
  uint32_t *dfd;
  char *__s;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  ulong local_38 [3];
  
  dfd = (uint32_t *)vk2dfd(vkFormat);
  if (dfd == (uint32_t *)0x0) {
    __s = (char *)vkFormatString(vkFormat);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)local_38);
    iVar1 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar1 == 0) {
      local_38[0] = (ulong)vkFormat;
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)0x20aba6,fmt,args);
      if (local_58 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_48) {
        operator_delete(local_58,local_48 + 1);
      }
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      if (local_58 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_48) {
        local_78.field_2._8_8_ = uStack_40;
      }
      else {
        local_78._M_dataplus._M_p = (pointer)local_58;
      }
      local_78.field_2._M_allocated_capacity = local_48;
      local_78._M_string_length = local_50;
    }
    Reporter::fatal<char_const(&)[43],std::__cxx11::string>
              (report,DFD_FAILURE,(char (*) [43])"Failed to create format descriptor for: {}",
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  createFormatDescriptor(__return_storage_ptr__,dfd);
  if (dfd != (uint32_t *)0x0) {
    free(dfd);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(VkFormat vkFormat, Reporter& report) {
    const auto dfd = std::unique_ptr<uint32_t[], decltype(std::free)*>(vk2dfd(vkFormat), std::free);
    if (!dfd)
        report.fatal(rc::DFD_FAILURE, "Failed to create format descriptor for: {}", toString(vkFormat));

    return createFormatDescriptor(dfd.get());
}